

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall
QWidgetPrivate::childAtRecursiveHelper
          (QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  bool bVar1;
  qsizetype qVar2;
  QWidget *pQVar3;
  undefined1 in_DL;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QWidget *child;
  int i;
  QPointF childPoint;
  QRect *in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffff90;
  int iVar4;
  undefined3 in_stack_ffffffffffffffb4;
  uint uVar5;
  QWidgetPrivate *this_00;
  QWidget *local_38;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffb4) & 0x1ffffff;
  this_00 = in_RDI;
  qVar2 = QList<QObject_*>::size((QList<QObject_*> *)&in_RDI->field_0x18);
  iVar4 = (int)qVar2;
  do {
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 < 0) {
        local_38 = (QWidget *)0x0;
        goto LAB_0037def6;
      }
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88)
      ;
      local_38 = qobject_cast<QWidget*>((QObject *)in_stack_ffffffffffffff88);
    } while ((((local_38 == (QWidget *)0x0) ||
              (bVar1 = QWidget::isWindow(in_stack_ffffffffffffff90), bVar1)) ||
             (bVar1 = QWidget::isHidden((QWidget *)0x37ddde), bVar1)) ||
            ((bVar1 = QWidget::testAttribute
                                ((QWidget *)in_RDI,
                                 (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20)), bVar1
             || (((uVar5 & 0x1000000) != 0 &&
                 ((*(uint *)&local_38->data->field_0x10 >> 0x12 & 1) != 0))))));
    local_18.xp = *(qreal *)in_RSI;
    local_18.yp = *(qreal *)&in_RSI->field_0x8;
    QRect::topLeft(in_stack_ffffffffffffff88);
    QPointF::QPointF((QPointF *)in_stack_ffffffffffffff90,(QPoint *)in_stack_ffffffffffffff88);
    QPointF::operator-=(&local_18,&local_28);
    QWidget::d_func((QWidget *)0x37de85);
    bVar1 = pointInsideRectAndMask(this_00,(QPointF *)in_RSI);
  } while (!bVar1);
  QWidget::d_func((QWidget *)0x37dea2);
  pQVar3 = childAtRecursiveHelper
                     (in_RSI,(QPointF *)CONCAT44(uVar5,iVar4),SUB81((ulong)local_38 >> 0x38,0));
  if (pQVar3 != (QWidget *)0x0) {
    local_38 = pQVar3;
  }
LAB_0037def6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_38;
}

Assistant:

QWidget *QWidgetPrivate::childAtRecursiveHelper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    for (int i = children.size() - 1; i >= 0; --i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || child->isWindow() || child->isHidden() || child->testAttribute(Qt::WA_TransparentForMouseEvents)
            || (ignoreChildrenInDestructor && child->data->in_destructor)) {
            continue;
        }

        // Map the point 'p' from parent coordinates to child coordinates.
        QPointF childPoint = p;
        childPoint -= child->data->crect.topLeft();

        // Check if the point hits the child.
        if (!child->d_func()->pointInsideRectAndMask(childPoint))
            continue;

        // Do the same for the child's descendants.
        if (QWidget *w = child->d_func()->childAtRecursiveHelper(childPoint, ignoreChildrenInDestructor))
            return w;

        // We have found our target; namely the child at position 'p'.
        return child;
    }
    return nullptr;
}